

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

int leveldb::anon_unknown_1::MaxOpenFiles(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 local_20 [8];
  rlimit rlim;
  
  if ((anonymous_namespace)::g_open_read_only_file_limit < 0) {
    iVar2 = getrlimit(RLIMIT_NOFILE,(rlimit *)local_20);
    if (iVar2 == 0) {
      if (local_20 == (undefined1  [8])0xffffffffffffffff) {
        (anonymous_namespace)::g_open_read_only_file_limit = std::numeric_limits<int>::max();
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_20;
        (anonymous_namespace)::g_open_read_only_file_limit = SUB164(auVar1 / ZEXT816(5),0);
      }
    }
    else {
      (anonymous_namespace)::g_open_read_only_file_limit = 0x32;
    }
    rlim.rlim_max._4_4_ = (anonymous_namespace)::g_open_read_only_file_limit;
  }
  else {
    rlim.rlim_max._4_4_ = (anonymous_namespace)::g_open_read_only_file_limit;
  }
  (anonymous_namespace)::g_open_read_only_file_limit = rlim.rlim_max._4_4_;
  return rlim.rlim_max._4_4_;
}

Assistant:

int MaxOpenFiles() {
  if (g_open_read_only_file_limit >= 0) {
    return g_open_read_only_file_limit;
  }
  struct ::rlimit rlim;
  if (::getrlimit(RLIMIT_NOFILE, &rlim)) {
    // getrlimit failed, fallback to hard-coded default.
    g_open_read_only_file_limit = 50;
  } else if (rlim.rlim_cur == RLIM_INFINITY) {
    g_open_read_only_file_limit = std::numeric_limits<int>::max();
  } else {
    // Allow use of 20% of available file descriptors for read-only files.
    g_open_read_only_file_limit = rlim.rlim_cur / 5;
  }
  return g_open_read_only_file_limit;
}